

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void config_free(ConfigScanner *sc)

{
  SectionList *pSVar1;
  ConfigItem *pCVar2;
  ConfigItem *__ptr;
  SectionList *__ptr_00;
  SectionList *__ptr_01;
  ConfigItem *__ptr_02;
  
  if (sc != (ConfigScanner *)0x0) {
    if (sc->first_item != (ConfigItem *)0x0) {
      pCVar2 = sc->first_item;
      __ptr_02 = (ConfigItem *)0x0;
      do {
        __ptr = pCVar2;
        if (__ptr_02 != (ConfigItem *)0x0) {
          free(__ptr_02);
        }
        if (__ptr->key != (char *)0x0) {
          free(__ptr->key);
        }
        if ((__ptr->vtype == VTYPE_STRING) && ((__ptr->value).v_string != (char *)0x0)) {
          free((__ptr->value).v_string);
        }
        pCVar2 = __ptr->succ;
        __ptr_02 = __ptr;
      } while (__ptr->succ != (ConfigItem_t *)0x0);
      free(__ptr);
    }
    if (sc->first_section != (SectionList *)0x0) {
      pSVar1 = sc->first_section;
      __ptr_01 = (SectionList *)0x0;
      do {
        __ptr_00 = pSVar1;
        if (__ptr_01 != (SectionList *)0x0) {
          free(__ptr_01);
        }
        if (__ptr_00->name != (char *)0x0) {
          free(__ptr_00->name);
        }
        pSVar1 = __ptr_00->succ;
        __ptr_01 = __ptr_00;
      } while (__ptr_00->succ != (SectionList_t *)0x0);
      free(__ptr_00);
    }
    if (sc->base != (char *)0x0) {
      free(sc->base);
    }
    free(sc);
    return;
  }
  return;
}

Assistant:

void config_free(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	ConfigItem *c_item = sc->first_item;
	ConfigItem *c_prev = NULL;
	while (c_item != NULL)
	{
		if (c_prev)
		{
			free(c_prev);
		}
		if (c_item->key)
		{
			free(c_item->key);
		}
		if (c_item->vtype == VTYPE_STRING && c_item->value.v_string)
		{
			free(c_item->value.v_string);
		}
		c_prev = c_item;
		c_item = c_item->succ;
	}
	if (c_prev)
	{
		free(c_prev);
	}

	SectionList *s_item = sc->first_section;
	SectionList *s_prev = NULL;
	while (s_item != NULL)
	{
		if (s_prev)
		{
			free(s_prev);
		}
		if (s_item->name)
		{
			free(s_item->name);
		}
		s_prev = s_item;
		s_item = s_item->succ;
	}
	if (s_prev)
	{
		free(s_prev);
	}

	if (sc != NULL && sc->base != NULL)
	{
		free(sc->base);
	}

	if (sc != NULL)
	{
		free(sc);
	}
}